

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_thread.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  pthread_t *__newthread;
  bool bVar5;
  pthread_t apStack_30 [2];
  
  apStack_30[0] = 0x102242;
  uVar3 = atoi(argv[1]);
  lVar2 = -((ulong)uVar3 * 8 + 0xf & 0xfffffffffffffff0);
  __newthread = (pthread_t *)((long)apStack_30 + lVar2 + 8);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  uVar4 = (ulong)uVar3;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    *(undefined8 *)((long)apStack_30 + lVar2) = 0x10227e;
    pthread_create(__newthread,(pthread_attr_t *)0x0,routine_func,(void *)0x0);
    __newthread = __newthread + 1;
  }
  *(undefined8 *)((long)apStack_30 + lVar2) = 1;
  uVar1 = *(undefined8 *)((long)apStack_30 + lVar2);
  do {
    *(undefined8 *)((long)apStack_30 + lVar2) = 0x10228e;
    sleep((uint)uVar1);
  } while( true );
}

Assistant:

int main(int argc,char *argv[])
{
	int cnt = atoi( argv[1] );

	pthread_t tid[ cnt ];
	for(int i=0;i<cnt;i++)
	{
		pthread_create( tid + i,NULL,routine_func,0);
	}
	for(;;)
	{
		sleep(1);
	}
	
	return 0;
}